

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ExecuteTests(cmCTest *this)

{
  cmCTestGenericHandler *pcVar1;
  bool bVar2;
  int iVar3;
  pointer pPVar4;
  ostream *poVar5;
  char *pcVar6;
  reference ppcVar7;
  cmCTestScriptHandler *pcVar8;
  void *pvVar9;
  ulong uVar10;
  string local_770 [32];
  ostringstream local_750 [8];
  ostringstream cmCTestLog_msg_3;
  string local_5d0 [32];
  undefined1 local_5b0 [8];
  ostringstream cmCTestLog_msg_2;
  string local_430;
  undefined1 local_410 [8];
  string workDir;
  string currDir;
  cmCTestGenericHandler **handler_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *__range2_1;
  ostringstream local_378 [8];
  ostringstream cmCTestLog_msg_1;
  cmCTestGenericHandler **handler;
  iterator __end2;
  iterator __begin2;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *__range2;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  int local_1c;
  int res;
  cmCTest *this_local;
  
  pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar4->RunConfigurationScript & 1U) == 0) {
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar2 = pPVar4->Verbose;
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar4->ExtraVerbose = (bool)(bVar2 & 1);
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar4->Verbose = true;
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    Private::GetTestingHandlers
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &__begin2_1,pPVar4);
    __end2_1 = std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::begin
                         ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                           *)&__begin2_1);
    handler_1 = (cmCTestGenericHandler **)
                std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::end
                          ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                            *)&__begin2_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                               *)&handler_1), bVar2) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                ::operator*(&__end2_1);
      pcVar1 = *ppcVar7;
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      cmCTestGenericHandler::SetVerbose(pcVar1,(bool)(pPVar4->Verbose & 1));
      pcVar1 = *ppcVar7;
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      cmCTestGenericHandler::SetSubmitIndex(pcVar1,pPVar4->SubmitIndex);
      __gnu_cxx::
      __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::~vector
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &__begin2_1);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    std::__cxx11::string::string((string *)local_410,(string *)(workDir.field_2._M_local_buf + 8));
    std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
              (&this->Impl);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      cmsys::SystemTools::CollapseFullPath(&local_430,&pPVar4->TestDir);
      std::__cxx11::string::operator=((string *)local_410,(string *)&local_430);
      std::__cxx11::string::~string((string *)&local_430);
    }
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&workDir.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_410);
    if ((!bVar2) || (bVar2 = TryToChangeDirectory(this,(string *)local_410), bVar2)) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar3 = Initialize(this,pcVar6,(cmCTestStartCommand *)0x0);
      if (iVar3 == 0) {
        local_1c = 0xc;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
        poVar5 = std::operator<<((ostream *)local_5b0,"Problem initializing the dashboard.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xb5d,pcVar6,false);
        std::__cxx11::string::~string(local_5d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      }
      else {
        local_1c = ProcessSteps(this);
      }
      Finalize(this);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&workDir.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_410);
      if (bVar2) {
        cmsys::SystemTools::ChangeDirectory((string *)((long)&workDir.field_2 + 8));
      }
      bVar2 = false;
    }
    else {
      this_local._4_4_ = 1;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_410);
    std::__cxx11::string::~string((string *)(workDir.field_2._M_local_buf + 8));
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  else {
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    if ((pPVar4->ExtraVerbose & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar5 = std::operator<<((ostream *)local_198,"* Extra verbosity turned on");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xb37,pcVar6,false);
      std::__cxx11::string::~string((string *)&__range2);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    Private::GetTestingHandlers
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &__begin2,pPVar4);
    __end2 = std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::begin
                       ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *
                        )&__begin2);
    handler = (cmCTestGenericHandler **)
              std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::end
                        ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                          *)&__begin2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                                       *)&handler), bVar2) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                ::operator*(&__end2);
      pcVar1 = *ppcVar7;
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      cmCTestGenericHandler::SetVerbose(pcVar1,(bool)(pPVar4->ExtraVerbose & 1));
      pcVar1 = *ppcVar7;
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      cmCTestGenericHandler::SetSubmitIndex(pcVar1,pPVar4->SubmitIndex);
      __gnu_cxx::
      __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::~vector
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &__begin2);
    pcVar8 = GetScriptHandler(this);
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    cmCTestGenericHandler::SetVerbose
              (&pcVar8->super_cmCTestGenericHandler,(bool)(pPVar4->Verbose & 1));
    pcVar8 = GetScriptHandler(this);
    local_1c = (*(pcVar8->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
    if (local_1c != 0) {
      std::__cxx11::ostringstream::ostringstream(local_378);
      poVar5 = std::operator<<((ostream *)local_378,"running script failing returning: ");
      pvVar9 = (void *)std::ostream::operator<<(poVar5,local_1c);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xb41,pcVar6,false);
      std::__cxx11::string::~string((string *)&__range2_1);
      std::__cxx11::ostringstream::~ostringstream(local_378);
    }
  }
  if (local_1c != 0) {
    std::__cxx11::ostringstream::ostringstream(local_750);
    poVar5 = std::operator<<((ostream *)local_750,"Running a test(s) failed returning : ");
    pvVar9 = (void *)std::ostream::operator<<(poVar5,local_1c);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xb69,pcVar6,false);
    std::__cxx11::string::~string(local_770);
    std::__cxx11::ostringstream::~ostringstream(local_750);
  }
  return local_1c;
}

Assistant:

int cmCTest::ExecuteTests()
{
  int res;
  // call process directory
  if (this->Impl->RunConfigurationScript) {
    if (this->Impl->ExtraVerbose) {
      cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
    }
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->ExtraVerbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }
    this->GetScriptHandler()->SetVerbose(this->Impl->Verbose);
    res = this->GetScriptHandler()->ProcessHandler();
    if (res != 0) {
      cmCTestLog(this, DEBUG,
                 "running script failing returning: " << res << std::endl);
    }

  } else {
    // What is this?  -V seems to be the same as -VV,
    // and Verbose is always on in this case
    this->Impl->ExtraVerbose = this->Impl->Verbose;
    this->Impl->Verbose = true;
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->Verbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }

    const std::string currDir = cmSystemTools::GetCurrentWorkingDirectory();
    std::string workDir = currDir;
    if (!this->Impl->TestDir.empty()) {
      workDir = cmSystemTools::CollapseFullPath(this->Impl->TestDir);
    }

    if (currDir != workDir) {
      if (!this->TryToChangeDirectory(workDir)) {
        return 1;
      }
    }

    if (!this->Initialize(workDir.c_str(), nullptr)) {
      res = 12;
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem initializing the dashboard." << std::endl);
    } else {
      res = this->ProcessSteps();
    }
    this->Finalize();

    if (currDir != workDir) {
      cmSystemTools::ChangeDirectory(currDir);
    }
  }
  if (res != 0) {
    cmCTestLog(this, DEBUG,
               "Running a test(s) failed returning : " << res << std::endl);
  }
  return res;
}